

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

tb_page_addr_t
get_page_addr_code_hostp_aarch64(CPUArchState_conflict1 *env,target_ulong addr,void **hostp)

{
  uc_struct_conflict2 *uc_00;
  _Bool _Var1;
  int mmu_idx_00;
  uintptr_t mmu_idx_01;
  uintptr_t index_00;
  CPUState *cpu;
  void *ptr;
  void *p;
  CPUTLBEntry *entry;
  uintptr_t index;
  uintptr_t mmu_idx;
  uc_struct_conflict2 *uc;
  void **hostp_local;
  target_ulong addr_local;
  CPUArchState_conflict1 *env_local;
  
  uc_00 = env->uc;
  mmu_idx_00 = cpu_mmu_index(env,true);
  mmu_idx_01 = (uintptr_t)mmu_idx_00;
  index_00 = tlb_index(env,mmu_idx_01,addr);
  p = tlb_entry(env,mmu_idx_01,addr);
  _Var1 = tlb_hit(uc_00,*(target_ulong *)((long)&((CPUTLBEntry *)p)->field_0 + 0x10),addr);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    _Var1 = victim_tlb_hit(env,mmu_idx_01,index_00,0x10,addr & uc_00->init_target_page->mask);
    if (!_Var1) {
      cpu = env_cpu(env);
      tlb_fill(cpu,addr,0,MMU_INST_FETCH,mmu_idx_00,0);
      tlb_index(env,mmu_idx_01,addr);
      p = tlb_entry(env,mmu_idx_01,addr);
      if (((undefined1  [64])((CPUTLBEntry *)p)->field_0 & (undefined1  [64])0x200) !=
          (undefined1  [64])0x0) {
        return 0xffffffffffffffff;
      }
    }
    _Var1 = tlb_hit(uc_00,*(target_ulong *)((long)p + 0x10),addr);
    if (!_Var1) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_aarch64(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((*(ulong *)((long)p + 0x10) & 0x80) == 0) {
    ptr = (void *)(addr + *(long *)((long)p + 0x20));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    env_local = (CPUArchState_conflict1 *)qemu_ram_addr_from_host_nofail(env->uc,ptr);
  }
  else {
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
    env_local = (CPUArchState_conflict1 *)0xffffffffffffffff;
  }
  return (tb_page_addr_t)env_local;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}